

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_sub(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  int iVar2;
  mp_int *b_00;
  
  iVar2 = a->sign;
  if (iVar2 == b->sign) {
    iVar1 = mp_cmp_mag(a,b);
    if (iVar1 == -1) {
      c->sign = (uint)(iVar2 == 0);
      b_00 = a;
      a = b;
    }
    else {
      c->sign = iVar2;
      b_00 = b;
    }
    iVar2 = s_mp_sub(a,b_00,c);
    return iVar2;
  }
  c->sign = iVar2;
  iVar2 = s_mp_add(a,b,c);
  return iVar2;
}

Assistant:

int mp_sub (mp_int * a, mp_int * b, mp_int * c)
{
  int     sa, sb, res;

  sa = a->sign;
  sb = b->sign;

  if (sa != sb) {
    /* subtract a negative from a positive, OR */
    /* subtract a positive from a negative. */
    /* In either case, ADD their magnitudes, */
    /* and use the sign of the first number. */
    c->sign = sa;
    res = s_mp_add (a, b, c);
  } else {
    /* subtract a positive from a positive, OR */
    /* subtract a negative from a negative. */
    /* First, take the difference between their */
    /* magnitudes, then... */
    if (mp_cmp_mag (a, b) != MP_LT) {
      /* Copy the sign from the first */
      c->sign = sa;
      /* The first has a larger or equal magnitude */
      res = s_mp_sub (a, b, c);
    } else {
      /* The result has the *opposite* sign from */
      /* the first number. */
      c->sign = (sa == MP_ZPOS) ? MP_NEG : MP_ZPOS;
      /* The second has a larger magnitude */
      res = s_mp_sub (b, a, c);
    }
  }
  return res;
}